

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGeneratorMocUic::JobParseT::ParseMocHeader(JobParseT *this,WorkerT *wrk,MetaT *meta)

{
  pointer pcVar1;
  MetaT *content;
  bool bVar2;
  JobMocT *this_00;
  string macroName;
  _Head_base<0UL,_cmQtAutoGeneratorMocUic::JobT_*,_false> local_e0;
  string local_d8;
  MetaT *local_b8;
  string local_b0;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  string local_50;
  
  MocSettingsT::FindMacro(&local_b0,&wrk->Gen_->Moc_,&meta->Content);
  if (local_b0._M_string_length == 0) {
    bVar2 = true;
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    pcVar1 = (this->FileName)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d8,pcVar1,pcVar1 + (this->FileName)._M_string_length);
    local_60 = 0;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    local_b8 = meta;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    this_00 = (JobMocT *)operator_new(0xc0);
    local_50.field_2._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    local_50.field_2._8_8_ = uStack_58;
    local_50._M_string_length = 0;
    local_68 = 0;
    local_60 = 0;
    local_70 = &local_60;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    JobMocT::JobMocT(this_00,&local_d8,&local_50,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    content = local_b8;
    local_e0._M_head_impl = (JobT *)this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    MocSettingsT::FindDependencies(&wrk->Gen_->Moc_,&content->Content,&this_00->Depends);
    this_00->DependsValid = true;
    bVar2 = ParallelJobPushMoc(wrk->Gen_,(JobHandleT *)&local_e0);
    if ((JobMocT *)local_e0._M_head_impl != (JobMocT *)0x0) {
      (*((JobT *)&(local_e0._M_head_impl)->_vptr_JobT)->_vptr_JobT[1])();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGeneratorMocUic::JobParseT::ParseMocHeader(WorkerT& wrk,
                                                        MetaT const& meta)
{
  bool success = true;
  std::string const macroName = wrk.Moc().FindMacro(meta.Content);
  if (!macroName.empty()) {
    JobHandleT jobHandle = cm::make_unique<JobMocT>(
      std::string(FileName), std::string(), std::string());
    // Read dependencies from this source
    static_cast<JobMocT&>(*jobHandle).FindDependencies(wrk, meta.Content);
    success = wrk.Gen().ParallelJobPushMoc(jobHandle);
  }
  return success;
}